

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

int32 bio_fread_3d(void ****arr,size_t e_sz,uint32 *d1,uint32 *d2,uint32 *d3,FILE *fp,uint32 swap,
                  uint32 *chksum)

{
  int32 iVar1;
  uint32 uVar2;
  void ***pppvVar3;
  char *fmt;
  long ln;
  uint32 n;
  uint32 l_d3;
  uint32 l_d2;
  uint32 l_d1;
  size_t local_50;
  ulong local_48;
  void ****local_40;
  void *raw;
  
  iVar1 = bio_fread(&l_d1,4,1,fp,swap,chksum);
  if (iVar1 == 1) {
    local_50 = e_sz;
    local_40 = arr;
    iVar1 = bio_fread(&l_d2,4,1,fp,swap,chksum);
    if (iVar1 == 1) {
      iVar1 = bio_fread(&l_d3,4,1,fp,swap,chksum);
      if (iVar1 == 1) {
        uVar2 = bio_fread_1d(&raw,local_50,&n,fp,swap,chksum);
        if (uVar2 != n) {
          return -1;
        }
        local_48 = (ulong)l_d3;
        if (uVar2 != l_d2 * l_d1 * l_d3) {
          __assert_fail("n == l_d1 * l_d2 * l_d3",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                        ,0x1e1,
                        "int32 bio_fread_3d(void ****, size_t, uint32 *, uint32 *, uint32 *, FILE *, uint32, uint32 *)"
                       );
        }
        pppvVar3 = (void ***)
                   __ckd_alloc_3d_ptr((ulong)l_d1,(ulong)l_d2,local_48,raw,local_50,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                                      ,0x1e3);
        *local_40 = pppvVar3;
        *d1 = l_d1;
        *d2 = l_d2;
        *d3 = (uint32)local_48;
        return uVar2;
      }
      if (iVar1 == 0) {
        fmt = "Unable to read complete data";
        ln = 0x1d5;
      }
      else {
        fmt = "OS error in bio_fread_3d";
        ln = 0x1d8;
      }
    }
    else if (iVar1 == 0) {
      fmt = "Unable to read complete data";
      ln = 0x1cb;
    }
    else {
      fmt = "OS error in bio_fread_3d";
      ln = 0x1ce;
    }
  }
  else if (iVar1 == 0) {
    fmt = "Unable to read complete data";
    ln = 0x1c1;
  }
  else {
    fmt = "OS error in bio_fread_3d";
    ln = 0x1c4;
  }
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                 ,ln,fmt);
  return -1;
}

Assistant:

int32
bio_fread_3d(void ****arr,
             size_t e_sz,
             uint32 *d1,
             uint32 *d2,
             uint32 *d3,
             FILE *fp,
             uint32 swap,
             uint32 *chksum)
{
    uint32 l_d1;
    uint32 l_d2;
    uint32 l_d3;
    uint32 n;
    void *raw;
    size_t ret;

    ret = bio_fread(&l_d1, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return -1;
    }
    ret = bio_fread(&l_d2, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return -1;
    }
    ret = bio_fread(&l_d3, sizeof(uint32), 1, fp, swap, chksum);
    if (ret != 1) {
	if (ret == 0) {
	    E_ERROR_SYSTEM("Unable to read complete data");
	}
	else {
	    E_ERROR_SYSTEM("OS error in bio_fread_3d");
	}
	return -1;
    }

    if (bio_fread_1d(&raw, e_sz, &n, fp, swap, chksum) != n) {
	return -1;
    }

    assert(n == l_d1 * l_d2 * l_d3);

    *arr = ckd_alloc_3d_ptr(l_d1, l_d2, l_d3, raw, e_sz);
    *d1 = l_d1;
    *d2 = l_d2;
    *d3 = l_d3;
    
    return n;
}